

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O0

Name wasm::Names::getValidElementSegmentName(Module *module,Name root)

{
  IString IVar1;
  function<bool_(wasm::Name)> *in_RCX;
  Name NVar2;
  anon_class_8_1_616f97aa local_70;
  function<bool_(wasm::Name)> local_68;
  Module *local_48;
  char *pcStack_40;
  Module *local_30;
  Module *module_local;
  Name root_local;
  
  pcStack_40 = root.super_IString.str._M_str;
  local_48 = root.super_IString.str._M_len;
  local_70.module = module;
  local_30 = module;
  module_local = local_48;
  root_local.super_IString.str._M_len = (size_t)pcStack_40;
  std::function<bool(wasm::Name)>::
  function<wasm::Names::getValidElementSegmentName(wasm::Module&,wasm::Name)::_lambda(wasm::Name)_1_,void>
            ((function<bool(wasm::Name)> *)&local_68,&local_70);
  NVar2.super_IString.str._M_str = (char *)&local_68;
  NVar2.super_IString.str._M_len = (size_t)pcStack_40;
  NVar2 = getValidName((Names *)local_48,NVar2,in_RCX);
  root_local.super_IString.str._M_str = NVar2.super_IString.str._M_len;
  std::function<bool_(wasm::Name)>::~function(&local_68);
  IVar1.str._M_str = NVar2.super_IString.str._M_str;
  IVar1.str._M_len = (size_t)root_local.super_IString.str._M_str;
  return (IString)(IString)IVar1.str;
}

Assistant:

inline Name getValidElementSegmentName(Module& module, Name root) {
  return getValidName(
    root, [&](Name test) { return !module.getElementSegmentOrNull(test); });
}